

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrmatrix.h
# Opt level: O2

void __thiscall
TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_>::TPZDohrMatrix
          (TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_> *this)

{
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZDohrMatrix_0181d8a8;
  (this->fGlobal).
  super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->fGlobal;
  (this->fGlobal).
  super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->fGlobal;
  (this->fGlobal).
  super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
  ._M_impl._M_node._M_size = 0;
  TPZAutoPointer<TPZDohrAssembly<double>_>::TPZAutoPointer(&this->fAssembly);
  return;
}

Assistant:

TPZDohrMatrix() : TPZMatrix<TVar>()
    {
        
    }